

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_compat.cpp
# Opt level: O1

MPP_RET mpp_compat_update(MppCompat *compat,RK_S32 value)

{
  if (((compat != (MppCompat *)0x0) &&
      (compats + compat->feature_id == compat && (int)compat->feature_id < 3)) &&
     (((uint)value < 2 || (compat->feature_type != MPP_COMPAT_BOOL)))) {
    compat->value_usr = value;
    return MPP_OK;
  }
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_compat_update(MppCompat *compat, RK_S32 value)
{
    if (NULL == compat)
        return MPP_NOK;

    if (compat->feature_id >= MPP_COMPAT_BUTT)
        return MPP_NOK;

    if (compat != &compats[compat->feature_id])
        return MPP_NOK;

    if (compat->feature_type == MPP_COMPAT_BOOL)
        if (value != 0 && value != 1)
            return MPP_NOK;

    compat->value_usr = value;
    return MPP_OK;
}